

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

uint8_t cfd::core::SetPsbtInput
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
                  vector<unsigned_char,_std::allocator<unsigned_char>_> *value,
                  wally_psbt_input *input)

{
  allocator<unsigned_char> *paVar1;
  wally_psbt_input *pwVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_00;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  CfdException *pCVar6;
  undefined8 uVar7;
  uchar *puVar8;
  uchar *puVar9;
  wally_map *pwVar10;
  size_type sVar11;
  ulong __n;
  uint *puVar12;
  pointer __n_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  allocator local_969;
  string local_968;
  CfdSourceLocation local_948;
  allocator local_929;
  string local_928;
  undefined1 local_902;
  allocator local_901;
  string local_900;
  CfdSourceLocation local_8e0;
  undefined1 local_8c2;
  allocator local_8c1;
  string local_8c0;
  CfdSourceLocation local_8a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_888;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *stack_data;
  iterator __end11;
  iterator __begin11;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range11;
  string local_860;
  CfdSourceLocation local_840;
  undefined8 local_828;
  wally_tx_witness_stack *stack;
  pointer local_808;
  uint64_t idx;
  undefined1 local_7f8 [8];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack_list;
  uint64_t num;
  Deserializer parser_1;
  string local_7a8;
  CfdSourceLocation local_788;
  undefined1 local_76a;
  allocator local_769;
  string local_768;
  CfdSourceLocation local_748;
  undefined1 local_72a;
  allocator local_729;
  string local_728;
  CfdSourceLocation local_708;
  undefined1 local_6ea;
  allocator local_6e9;
  string local_6e8;
  CfdSourceLocation local_6c8;
  allocator<unsigned_int> local_6a9;
  undefined1 local_6a8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  size_t path_len;
  string local_680;
  CfdSourceLocation local_660;
  allocator local_641;
  string local_640;
  ByteData local_620;
  undefined1 local_608 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes_1;
  undefined1 local_5d8 [8];
  Pubkey pk_1;
  undefined1 local_5b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_1;
  string local_598;
  CfdSourceLocation local_578;
  undefined1 local_55a;
  allocator local_559;
  string local_558;
  CfdSourceLocation local_538;
  undefined1 local_51a;
  allocator local_519;
  string local_518;
  CfdSourceLocation local_4f8;
  undefined1 local_4da;
  allocator local_4d9;
  string local_4d8;
  CfdSourceLocation local_4b8;
  undefined1 local_49a;
  allocator local_499;
  string local_498;
  CfdSourceLocation local_478;
  undefined4 local_460;
  undefined1 local_45a;
  allocator local_459;
  uint32_t sighash;
  CfdSourceLocation local_438;
  undefined1 local_41a;
  allocator local_419;
  string local_418;
  CfdSourceLocation local_3f8;
  undefined1 local_3da;
  allocator local_3d9;
  string local_3d8;
  CfdSourceLocation local_3b8;
  allocator local_399;
  string local_398;
  ByteData local_378;
  undefined1 local_360 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  undefined1 local_330 [8];
  Pubkey pk;
  undefined1 local_310 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  string local_2f0;
  CfdSourceLocation local_2d0;
  pointer puStack_2b8;
  wally_tx_output txout;
  undefined1 local_240 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script;
  uint64_t amount;
  Deserializer parser;
  string local_1f0;
  CfdSourceLocation local_1d0;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0;
  CfdSourceLocation local_190;
  undefined1 local_172;
  allocator local_171;
  string local_170;
  CfdSourceLocation local_150;
  undefined1 local_132;
  allocator local_131;
  string local_130;
  CfdSourceLocation local_110;
  string local_f8;
  long local_d8;
  wally_tx *wally_tx_obj;
  undefined1 local_b8 [8];
  Transaction tx;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  byte local_25;
  int local_24;
  bool has_key_1byte;
  wally_psbt_input *pwStack_20;
  int ret;
  wally_psbt_input *input_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_local;
  
  pwStack_20 = input;
  input_local = (wally_psbt_input *)value;
  value_local = key;
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)key);
  local_25 = sVar4 == 1;
  pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,0);
  if (*pvVar5 == '\0') {
    if ((local_25 & 1) == 0) {
      local_40.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_40.filename = local_40.filename + 1;
      local_40.line = 0x3df;
      local_40.funcname = "SetPsbtInput";
      logger::warn<>(&local_40,"psbt invalid key format.");
      tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_60,"psbt invalid key format error.",&local_61)
      ;
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_60);
      tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData((ByteData *)&wally_tx_obj,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)input_local);
    Transaction::Transaction((Transaction *)local_b8,(ByteData *)&wally_tx_obj);
    ByteData::~ByteData((ByteData *)&wally_tx_obj);
    local_d8 = 0;
    AbstractTransaction::GetHex_abi_cxx11_(&local_f8,(AbstractTransaction *)local_b8);
    uVar7 = ::std::__cxx11::string::c_str();
    local_24 = wally_tx_from_hex(uVar7,0,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    if (local_24 != 0) {
      local_110.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_110.filename = local_110.filename + 1;
      local_110.line = 999;
      local_110.funcname = "SetPsbtInput";
      logger::warn<int&>(&local_110,"wally_tx_from_hex NG[{}]",&local_24);
      local_132 = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_130,"psbt tx from hex error.",&local_131);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_130);
      local_132 = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((*(long *)(local_d8 + 0x10) == 0) || (*(long *)(local_d8 + 0x28) == 0)) {
      wally_tx_free(local_d8);
      local_150.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_150.filename = local_150.filename + 1;
      local_150.line = 0x3ec;
      local_150.funcname = "SetPsbtInput";
      logger::warn<>(&local_150,"invalind utxo transaction format.");
      local_172 = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_170,"psbt invalid tx error.",&local_171);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_170);
      local_172 = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_24 = wally_psbt_input_set_utxo(pwStack_20,local_d8);
    wally_tx_free(local_d8);
    if (local_24 != 0) {
      local_190.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_190.filename = local_190.filename + 1;
      local_190.line = 0x3f3;
      local_190.funcname = "SetPsbtInput";
      logger::warn<int&>(&local_190,"wally_psbt_input_set_utxo NG[{}]",&local_24);
      local_1b2 = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1b0,"psbt set input utxo error.",&local_1b1);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_1b0);
      local_1b2 = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Transaction::~Transaction((Transaction *)local_b8);
  }
  else {
    pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,0);
    if (*pvVar5 == '\x01') {
      if ((local_25 & 1) == 0) {
        local_1d0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_1d0.filename = local_1d0.filename + 1;
        local_1d0.line = 0x3f9;
        local_1d0.funcname = "SetPsbtInput";
        logger::warn<>(&local_1d0,"psbt invalid key format.");
        parser._38_1_ = 1;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_1f0,"psbt invalid key format error.",
                   (allocator *)&parser.field_0x27);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_1f0);
        parser._38_1_ = 0;
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      Deserializer::Deserializer
                ((Deserializer *)&amount,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)input_local);
      script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)Deserializer::ReadUint64((Deserializer *)&amount);
      Deserializer::ReadVariableBuffer
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240,
                 (Deserializer *)&amount);
      txout.surjectionproof_len = 0;
      txout.rangeproof = (uchar *)0x0;
      txout.nonce_len = 0;
      txout.surjectionproof = (uchar *)0x0;
      txout.value_len = 0;
      txout.nonce = (uchar *)0x0;
      txout.asset_len = 0;
      txout.value = (uchar *)0x0;
      txout.features = '\0';
      txout._25_7_ = 0;
      txout.asset = (uchar *)0x0;
      txout.script = (uchar *)0x0;
      txout.script_len = 0;
      txout.satoshi = 0;
      puStack_2b8 = script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage;
      txout.satoshi =
           (uint64_t)
           ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      txout.script = (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_240);
      local_24 = wally_psbt_input_set_witness_utxo(pwStack_20,&puStack_2b8);
      if (local_24 != 0) {
        local_2d0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_2d0.filename = local_2d0.filename + 1;
        local_2d0.line = 0x408;
        local_2d0.funcname = "SetPsbtInput";
        logger::warn<int&>(&local_2d0,"wally_psbt_input_set_witness_utxo NG[{}]",&local_24);
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_2f0,"psbt set output witnessUtxo error.",
                   (allocator *)
                   ((long)&pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_2f0);
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      Deserializer::~Deserializer((Deserializer *)&amount);
    }
    else {
      pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,0);
      if (*pvVar5 == '\x02') {
        sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local);
        paVar1 = (allocator<unsigned_char> *)
                 ((long)&pk.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7);
        ::std::allocator<unsigned_char>::allocator(paVar1);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_310,sVar4 - 1,
                   paVar1);
        ::std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&pk.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_310);
        if (sVar4 != 0) {
          puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_310);
          puVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local);
          sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_310);
          memcpy(puVar8,puVar9 + 1,sVar4);
        }
        ByteData::ByteData((ByteData *)
                           &pk_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_310);
        Pubkey::Pubkey((Pubkey *)local_330,
                       (ByteData *)
                       &pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        ByteData::~ByteData((ByteData *)
                            &pk_bytes.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        Pubkey::GetData(&local_378,(Pubkey *)local_330);
        ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360,
                           &local_378);
        ByteData::~ByteData(&local_378);
        pwVar10 = &pwStack_20->signatures;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_398,"input signatures",&local_399);
        FindPsbtMap(pwVar10,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360,
                    &local_398,(size_t *)0x0);
        ::std::__cxx11::string::~string((string *)&local_398);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_399);
        pwVar10 = &pwStack_20->signatures;
        puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360);
        sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360);
        puVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)input_local);
        sVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)input_local);
        local_24 = wally_map_add(pwVar10,puVar8,sVar4,puVar9,sVar11);
        if (local_24 != 0) {
          local_3b8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                       ,0x2f);
          local_3b8.filename = local_3b8.filename + 1;
          local_3b8.line = 0x419;
          local_3b8.funcname = "SetPsbtInput";
          logger::warn<int&>(&local_3b8,"wally_map_add NG[{}]",&local_24);
          local_3da = 1;
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_3d8,"psbt set input signatures error.",&local_3d9);
          CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_3d8);
          local_3da = 0;
          __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360);
        Pubkey::~Pubkey((Pubkey *)local_330);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_310);
      }
      else {
        pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,0);
        if (*pvVar5 == '\x03') {
          if ((local_25 & 1) == 0) {
            local_3f8.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_3f8.filename = local_3f8.filename + 1;
            local_3f8.line = 0x41f;
            local_3f8.funcname = "SetPsbtInput";
            logger::warn<>(&local_3f8,"psbt invalid key format.");
            local_41a = 1;
            pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_418,"psbt invalid key format error.",&local_419);
            CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_418);
            local_41a = 0;
            __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
          }
          sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)input_local);
          if (sVar4 < 4) {
            local_438.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_438.filename = local_438.filename + 1;
            local_438.line = 0x424;
            local_438.funcname = "SetPsbtInput";
            logger::warn<>(&local_438,"psbt invalid value format.");
            local_45a = 1;
            pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&sighash,"psbt invalid value format error.",&local_459);
            CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&sighash);
            local_45a = 0;
            __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
          }
          local_460 = 0;
          puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)input_local);
          local_460 = *(undefined4 *)puVar8;
          local_24 = wally_psbt_input_set_sighash(pwStack_20,local_460);
          if (local_24 != 0) {
            local_478.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_478.filename = local_478.filename + 1;
            local_478.line = 0x42d;
            local_478.funcname = "SetPsbtInput";
            logger::warn<int&>(&local_478,"wally_psbt_input_set_sighash NG[{}]",&local_24);
            local_49a = 1;
            pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_498,"psbt set input sighash error.",&local_499);
            CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_498);
            local_49a = 0;
            __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
          }
          local_24 = 0;
        }
        else {
          pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,0
                             );
          pwVar2 = pwStack_20;
          if (*pvVar5 == '\x04') {
            if ((local_25 & 1) == 0) {
              local_4b8.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                           ,0x2f);
              local_4b8.filename = local_4b8.filename + 1;
              local_4b8.line = 0x433;
              local_4b8.funcname = "SetPsbtInput";
              logger::warn<>(&local_4b8,"psbt invalid key format.");
              local_4da = 1;
              pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_4d8,"psbt invalid key format error.",&local_4d9);
              CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_4d8);
              local_4da = 0;
              __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
            }
            puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)input_local
                               );
            sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)input_local)
            ;
            local_24 = wally_psbt_input_set_redeem_script(pwVar2,puVar8,sVar4);
            if (local_24 != 0) {
              local_4f8.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                           ,0x2f);
              local_4f8.filename = local_4f8.filename + 1;
              local_4f8.line = 0x43a;
              local_4f8.funcname = "SetPsbtInput";
              logger::warn<int&>(&local_4f8,"wally_psbt_input_set_redeem_script NG[{}]",&local_24);
              local_51a = 1;
              pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_518,"psbt set input redeemScript error.",&local_519);
              CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_518);
              local_51a = 0;
              __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
            }
            local_24 = 0;
          }
          else {
            pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local
                                ,0);
            pwVar2 = pwStack_20;
            if (*pvVar5 == '\x05') {
              if ((local_25 & 1) == 0) {
                local_538.filename =
                     strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                             ,0x2f);
                local_538.filename = local_538.filename + 1;
                local_538.line = 0x440;
                local_538.funcname = "SetPsbtInput";
                logger::warn<>(&local_538,"psbt invalid key format.");
                local_55a = 1;
                pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_558,"psbt invalid key format error.",&local_559);
                CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_558);
                local_55a = 0;
                __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
              }
              puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  input_local);
              sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 input_local);
              local_24 = wally_psbt_input_set_witness_script(pwVar2,puVar8,sVar4);
              if (local_24 != 0) {
                local_578.filename =
                     strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                             ,0x2f);
                local_578.filename = local_578.filename + 1;
                local_578.line = 0x447;
                local_578.funcname = "SetPsbtInput";
                logger::warn<int&>(&local_578,"wally_psbt_input_set_witness_script NG[{}]",&local_24
                                  );
                pubkey_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
                pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_598,"psbt set input witnessScript error.",
                           (allocator *)
                           ((long)&pubkey_1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_598);
                pubkey_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
                __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
              }
              local_24 = 0;
            }
            else {
              pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  value_local,0);
              if (*pvVar5 == '\x06') {
                sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   value_local);
                paVar1 = (allocator<unsigned_char> *)
                         ((long)&pk_1.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                ::std::allocator<unsigned_char>::allocator(paVar1);
                ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5b8,
                           sVar4 - 1,paVar1);
                ::std::allocator<unsigned_char>::~allocator
                          ((allocator<unsigned_char> *)
                           ((long)&pk_1.data_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_5b8);
                if (sVar4 != 0) {
                  puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_5b8);
                  puVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      value_local);
                  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_5b8);
                  memcpy(puVar8,puVar9 + 1,sVar4);
                }
                ByteData::ByteData((ByteData *)
                                   &pk_bytes_1.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_5b8);
                Pubkey::Pubkey((Pubkey *)local_5d8,
                               (ByteData *)
                               &pk_bytes_1.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                ByteData::~ByteData((ByteData *)
                                    &pk_bytes_1.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                Pubkey::GetData(&local_620,(Pubkey *)local_5d8);
                ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_608,&local_620);
                ByteData::~ByteData(&local_620);
                pwVar10 = &pwStack_20->keypaths;
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_640,"input bip32 pubkey",&local_641)
                ;
                FindPsbtMap(pwVar10,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_608,&local_640,(size_t *)0x0);
                ::std::__cxx11::string::~string((string *)&local_640);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_641);
                sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   input_local);
                if (sVar4 < 4) {
                  local_660.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                               ,0x2f);
                  local_660.filename = local_660.filename + 1;
                  local_660.line = 0x455;
                  local_660.funcname = "SetPsbtInput";
                  logger::warn<>(&local_660,"psbt invalid value format.");
                  path_len._6_1_ = 1;
                  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            ((string *)&local_680,"psbt invalid value format error.",
                             (allocator *)((long)&path_len + 7));
                  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_680);
                  path_len._6_1_ = 0;
                  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                }
                sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   input_local);
                path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)(sVar4 - 4);
                __n = (ulong)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage >> 2;
                ::std::allocator<unsigned_int>::allocator(&local_6a9);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6a8,__n,
                           &local_6a9);
                ::std::allocator<unsigned_int>::~allocator(&local_6a9);
                if (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  puVar12 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       local_6a8);
                  puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      input_local);
                  memcpy(puVar12,puVar8 + 4,
                         (size_t)path.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                pwVar10 = &pwStack_20->keypaths;
                puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_608);
                sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_608);
                puVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    input_local);
                puVar12 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     local_6a8);
                sVar11 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6a8
                                   );
                local_24 = wally_map_add_keypath_item(pwVar10,puVar8,sVar4,puVar9,4,puVar12,sVar11);
                if (local_24 != 0) {
                  local_6c8.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                               ,0x2f);
                  local_6c8.filename = local_6c8.filename + 1;
                  local_6c8.line = 0x463;
                  local_6c8.funcname = "SetPsbtInput";
                  logger::warn<int&>(&local_6c8,"wally_map_add_keypath_item NG[{}]",&local_24);
                  local_6ea = 1;
                  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            ((string *)&local_6e8,"psbt set input pubkey error.",&local_6e9);
                  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_6e8);
                  local_6ea = 0;
                  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                }
                ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6a8);
                ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_608);
                Pubkey::~Pubkey((Pubkey *)local_5d8);
                ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5b8);
              }
              else {
                pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    value_local,0);
                pwVar2 = pwStack_20;
                if (*pvVar5 == '\a') {
                  if ((local_25 & 1) == 0) {
                    local_708.filename =
                         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                                 ,0x2f);
                    local_708.filename = local_708.filename + 1;
                    local_708.line = 0x469;
                    local_708.funcname = "SetPsbtInput";
                    logger::warn<>(&local_708,"psbt invalid key format.");
                    local_72a = 1;
                    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              ((string *)&local_728,"psbt invalid key format error.",&local_729);
                    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_728);
                    local_72a = 0;
                    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                  }
                  puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      input_local);
                  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     input_local);
                  local_24 = wally_psbt_input_set_final_scriptsig(pwVar2,puVar8,sVar4);
                  if (local_24 != 0) {
                    local_748.filename =
                         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                                 ,0x2f);
                    local_748.filename = local_748.filename + 1;
                    local_748.line = 0x470;
                    local_748.funcname = "SetPsbtInput";
                    logger::warn<int&>(&local_748,"wally_psbt_input_set_final_scriptsig NG[{}]",
                                       &local_24);
                    local_76a = 1;
                    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              ((string *)&local_768,"psbt set input final scriptsig error.",
                               &local_769);
                    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_768);
                    local_76a = 0;
                    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                  }
                  local_24 = 0;
                }
                else {
                  pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      value_local,0);
                  key_00 = value_local;
                  if (*pvVar5 == '\b') {
                    if ((local_25 & 1) == 0) {
                      local_788.filename =
                           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                                   ,0x2f);
                      local_788.filename = local_788.filename + 1;
                      local_788.line = 0x476;
                      local_788.funcname = "SetPsbtInput";
                      logger::warn<>(&local_788,"psbt invalid key format.");
                      parser_1._38_1_ = 1;
                      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                ((string *)&local_7a8,"psbt invalid key format error.",
                                 (allocator *)&parser_1.field_0x27);
                      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_7a8);
                      parser_1._38_1_ = 0;
                      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                    }
                    Deserializer::Deserializer
                              ((Deserializer *)&num,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)input_local)
                    ;
                    __n_00 = (pointer)Deserializer::ReadVariableInt((Deserializer *)&num);
                    stack_list.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = __n_00;
                    ::std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                    allocator((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)((long)&idx + 7));
                    ::std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_7f8,(size_type)__n_00,
                             (allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&idx + 7));
                    ::std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                    ~allocator((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)((long)&idx + 7));
                    for (local_808 = (pointer)0x0;
                        local_808 <
                        stack_list.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        local_808 = (pointer)((long)&(local_808->
                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1)) {
                      Deserializer::ReadVariableBuffer
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack,
                                 (Deserializer *)&num);
                      this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             ::std::
                             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                           *)local_7f8,(size_type)local_808);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &stack);
                      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack);
                    }
                    local_828 = 0;
                    local_24 = wally_tx_witness_stack_init_alloc
                                         (stack_list.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          &local_828);
                    if (local_24 != 0) {
                      local_840.filename =
                           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                                   ,0x2f);
                      local_840.filename = local_840.filename + 1;
                      local_840.line = 0x484;
                      local_840.funcname = "SetPsbtInput";
                      logger::warn<int&>(&local_840,"wally_tx_witness_stack_init_alloc NG[{}]",
                                         &local_24);
                      __range11._6_1_ = 1;
                      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                ((string *)&local_860,"psbt alloc witness stack error.",
                                 (allocator *)((long)&__range11 + 7));
                      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_860);
                      __range11._6_1_ = 0;
                      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                    }
                    __end11 = ::std::
                              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ::begin((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)local_7f8);
                    stack_data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 ::std::
                                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ::end((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)local_7f8);
                    while (bVar3 = __gnu_cxx::operator!=
                                             (&__end11,(
                                                  __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                                  *)&stack_data), bVar3) {
                      local_888 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  __gnu_cxx::
                                  __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                  ::operator*(&__end11);
                      uVar7 = local_828;
                      puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                         (local_888);
                      sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                        (local_888);
                      local_24 = wally_tx_witness_stack_add(uVar7,puVar8,sVar4);
                      if (local_24 != 0) {
                        wally_tx_witness_stack_free(local_828);
                        local_8a0.filename =
                             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                                     ,0x2f);
                        local_8a0.filename = local_8a0.filename + 1;
                        local_8a0.line = 0x48d;
                        local_8a0.funcname = "SetPsbtInput";
                        logger::warn<int&>(&local_8a0,"wally_tx_witness_stack_add NG[{}]",&local_24)
                        ;
                        local_8c2 = 1;
                        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                        ::std::allocator<char>::allocator();
                        ::std::__cxx11::string::string
                                  ((string *)&local_8c0,"psbt add witness stack error.",&local_8c1);
                        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_8c0);
                        local_8c2 = 0;
                        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                      }
                      __gnu_cxx::
                      __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::operator++(&__end11);
                    }
                    local_24 = wally_psbt_input_set_final_witness(pwStack_20,local_828);
                    wally_tx_witness_stack_free(local_828);
                    if (local_24 != 0) {
                      local_8e0.filename =
                           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                                   ,0x2f);
                      local_8e0.filename = local_8e0.filename + 1;
                      local_8e0.line = 0x495;
                      local_8e0.funcname = "SetPsbtInput";
                      logger::warn<int&>(&local_8e0,"wally_psbt_input_set_final_witness NG[{}]",
                                         &local_24);
                      local_902 = 1;
                      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                ((string *)&local_900,"psbt set input final witnessStack error.",
                                 &local_901);
                      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_900);
                      local_902 = 0;
                      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                    }
                    ::std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)local_7f8);
                    Deserializer::~Deserializer((Deserializer *)&num);
                  }
                  else {
                    pwVar10 = &pwStack_20->unknowns;
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string((string *)&local_928,"input unknowns",&local_929)
                    ;
                    FindPsbtMap(pwVar10,key_00,&local_928,(size_t *)0x0);
                    ::std::__cxx11::string::~string((string *)&local_928);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_929);
                    pwVar10 = &pwStack_20->unknowns;
                    puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        value_local);
                    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       value_local);
                    puVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        input_local);
                    sVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        input_local);
                    local_24 = wally_map_add(pwVar10,puVar8,sVar4,puVar9,sVar11);
                    if (local_24 != 0) {
                      local_948.filename =
                           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                                   ,0x2f);
                      local_948.filename = local_948.filename + 1;
                      local_948.line = 0x49f;
                      local_948.funcname = "SetPsbtInput";
                      logger::warn<int&>(&local_948,"wally_map_add NG[{}]",&local_24);
                      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                ((string *)&local_968,"psbt add input unknowns error.",&local_969);
                      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_968);
                      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                    }
                    local_24 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,0);
  return *pvVar5;
}

Assistant:

static uint8_t SetPsbtInput(
    const std::vector<uint8_t> &key, const std::vector<uint8_t> &value,
    struct wally_psbt_input *input) {
  int ret;
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtInputNonWitnessUtxo) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    Transaction tx(value);
    struct wally_tx *wally_tx_obj = nullptr;
    ret = wally_tx_from_hex(tx.GetHex().c_str(), 0, &wally_tx_obj);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}]", ret);
      throw CfdException(kCfdIllegalArgumentError, "psbt tx from hex error.");
    } else if (
        (wally_tx_obj->num_inputs == 0) || (wally_tx_obj->num_outputs == 0)) {
      wally_tx_free(wally_tx_obj);
      warn(CFD_LOG_SOURCE, "invalind utxo transaction format.");
      throw CfdException(kCfdIllegalArgumentError, "psbt invalid tx error.");
    }

    ret = wally_psbt_input_set_utxo(input, wally_tx_obj);
    wally_tx_free(wally_tx_obj);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_utxo NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set input utxo error.");
    }
  } else if (key[0] == Psbt::kPsbtInputWitnessUtxo) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    // TODO(k-matsuzawa) need endian support.
    Deserializer parser(value);
    uint64_t amount = parser.ReadUint64();
    auto script = parser.ReadVariableBuffer();
    struct wally_tx_output txout;
    memset(&txout, 0, sizeof(txout));
    txout.satoshi = static_cast<uint64_t>(amount);
    txout.script = script.data();
    txout.script_len = script.size();
    ret = wally_psbt_input_set_witness_utxo(input, &txout);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set output witnessUtxo error.");
    }
  } else if (key[0] == Psbt::kPsbtInputPartialSig) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    FindPsbtMap(&input->signatures, pk_bytes, "input signatures");

    ret = wally_map_add(
        &input->signatures, pk_bytes.data(), pk_bytes.size(), value.data(),
        value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set input signatures error.");
    }
  } else if (key[0] == Psbt::kPsbtInputSighashType) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (value.size() < 4) {
      warn(CFD_LOG_SOURCE, "psbt invalid value format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid value format error.");
    }
    // TODO(k-matsuzawa) need endian support.
    uint32_t sighash = 0;
    memcpy(&sighash, value.data(), sizeof(sighash));
    ret = wally_psbt_input_set_sighash(input, sighash);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_sighash NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set input sighash error.");
    }
  } else if (key[0] == Psbt::kPsbtInputRedeemScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    ret =
        wally_psbt_input_set_redeem_script(input, value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_redeem_script NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set input redeemScript error.");
    }
  } else if (key[0] == Psbt::kPsbtInputWitnessScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    ret =
        wally_psbt_input_set_witness_script(input, value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_script NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set input witnessScript error.");
    }
  } else if (key[0] == Psbt::kPsbtInputBip32Derivation) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    FindPsbtMap(&input->keypaths, pk_bytes, "input bip32 pubkey");

    if (value.size() < 4) {
      warn(CFD_LOG_SOURCE, "psbt invalid value format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid value format error.");
    }
    size_t path_len = value.size() - 4;
    std::vector<uint32_t> path(path_len / 4);
    if (path_len != 0) {
      // TODO(k-matsuzawa) need endian support.
      memcpy(path.data(), &value.data()[4], path_len);
    }
    ret = wally_map_add_keypath_item(
        &input->keypaths, pk_bytes.data(), pk_bytes.size(), value.data(), 4,
        path.data(), path.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_add_keypath_item NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set input pubkey error.");
    }
  } else if (key[0] == Psbt::kPsbtInputFinalScriptsig) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    ret = wally_psbt_input_set_final_scriptsig(
        input, value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_scriptsig NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set input final scriptsig error.");
    }
  } else if (key[0] == Psbt::kPsbtInputFinalScriptWitness) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    Deserializer parser(value);
    uint64_t num = parser.ReadVariableInt();
    std::vector<std::vector<uint8_t>> stack_list(num);
    for (uint64_t idx = 0; idx < num; ++idx) {
      stack_list[idx] = parser.ReadVariableBuffer();
    }

    struct wally_tx_witness_stack *stack = nullptr;
    ret = wally_tx_witness_stack_init_alloc(num, &stack);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_init_alloc NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt alloc witness stack error.");
    }
    for (const auto &stack_data : stack_list) {
      ret = wally_tx_witness_stack_add(
          stack, stack_data.data(), stack_data.size());
      if (ret != WALLY_OK) {
        wally_tx_witness_stack_free(stack);
        warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_add NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add witness stack error.");
      }
    }
    ret = wally_psbt_input_set_final_witness(input, stack);
    wally_tx_witness_stack_free(stack);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_witness NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt set input final witnessStack error.");
    }
  } else {
    FindPsbtMap(&input->unknowns, key, "input unknowns");
    ret = wally_map_add(
        &input->unknowns, key.data(), key.size(), value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt add input unknowns error.");
    }
  }
  return key[0];
}